

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O3

unsigned_short __thiscall
IDisk::GetTrackInfoForRev(IDisk *this,int side,int track,Track *track_buffer,int rev)

{
  pointer *ppaVar1;
  pointer paVar2;
  uchar *puVar3;
  ILog *pIVar4;
  iterator __position;
  bool bVar5;
  undefined8 uVar6;
  uchar uVar7;
  uchar uVar8;
  uint uVar9;
  int iVar10;
  uint *puVar11;
  Revolution *pRVar12;
  long *plVar13;
  byte bVar14;
  unsigned_short uVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  MFMTrack *pMVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  byte b;
  uint uVar27;
  Track *this_00;
  ushort uVar28;
  long lVar29;
  CRC crc_local;
  undefined1 local_b8;
  undefined1 local_b4;
  anon_struct_36_14_4aa84ee9 local_ac;
  long local_88;
  long local_80;
  undefined8 local_78;
  Side *local_70;
  Track *local_68;
  IDisk *local_60;
  CRC local_58;
  
  local_68 = track_buffer;
  CRC::CRC(&local_58);
  lVar20 = (long)rev;
  pMVar22 = this->side_[side].tracks;
  local_80 = (long)track * 0x20;
  lVar29 = lVar20 * 0x30;
  local_78 = CONCAT62((int6)(short)((uint)rev >> 0x10),0x100);
  if (pMVar22[track].revolution[lVar20].size != 0x40) {
    local_70 = this->side_ + side;
    pRVar12 = pMVar22[track].revolution + lVar20;
    uVar27 = 0;
    local_78 = CONCAT62((int6)((ulong)local_70 >> 0x10),0x100);
    local_88 = lVar29;
    do {
      if (uVar27 < 0x81) {
LAB_001631fa:
        uVar27 = uVar27 + 1;
      }
      else {
        puVar3 = pRVar12->bitfield;
        iVar18 = bcmp(&DAT_001a7c70,puVar3 + uVar27,0x40);
        if (iVar18 != 0) goto LAB_001631fa;
        uVar17 = 0xffffffffffffffff;
        uVar23 = uVar27 - 0x50;
        do {
          if ((puVar3[uVar23] != '\x01') || (puVar3[uVar23 + 1] != '\0')) goto LAB_001631fa;
          uVar23 = uVar23 + 2;
          uVar17 = uVar17 + 1;
        } while (uVar17 < 0x27);
        CRC::Reset(&local_58);
        CRC::AddByteToCrc(&local_58,0xa1);
        CRC::AddByteToCrc(&local_58,0xa1);
        CRC::AddByteToCrc(&local_58,0xa1);
        CRC::AddByteToCrc(&local_58,0xfe);
        local_ac.dam_sync_offset = 0;
        local_ac._28_4_ = 0;
        local_ac.index_end = 0;
        local_ac.c = '\0';
        local_ac.h = '\0';
        local_ac.r = '\0';
        local_ac.n = '\0';
        local_ac.chrn_crc_ok = false;
        local_ac.status1 = '\0';
        local_ac.status2 = '\0';
        local_ac._15_1_ = 0;
        local_ac.real_size = 0;
        local_ac._18_2_ = 0;
        local_ac.dam_offset = 0;
        local_ac.idam_offset = uVar27;
        local_ac.idam_sync_offset = uVar27 - 0x50;
        uVar7 = GetNextByteForRev(this,side,track,uVar27 + 0x40,rev);
        local_ac.c = uVar7;
        CRC::AddByteToCrc(&local_58,uVar7);
        uVar7 = GetNextByteForRev(this,side,track,uVar27 + 0x50,rev);
        local_ac.h = uVar7;
        CRC::AddByteToCrc(&local_58,uVar7);
        uVar7 = GetNextByteForRev(this,side,track,uVar27 + 0x60,rev);
        local_ac.r = uVar7;
        CRC::AddByteToCrc(&local_58,uVar7);
        uVar7 = GetNextByteForRev(this,side,track,uVar27 + 0x70,rev);
        local_ac.n = uVar7;
        CRC::AddByteToCrc(&local_58,uVar7);
        pIVar4 = this->log_;
        if (pIVar4 != (ILog *)0x0) {
          (*(code *)**(undefined8 **)pIVar4)(pIVar4,"Track : ");
          pIVar4 = this->log_;
          if (pIVar4 != (ILog *)0x0) {
            local_b4 = (undefined1)track;
            (**(code **)(*(long *)pIVar4 + 8))(pIVar4,local_b4);
            pIVar4 = this->log_;
            if (pIVar4 != (ILog *)0x0) {
              (*(code *)**(undefined8 **)pIVar4)(pIVar4," - REV :");
              pIVar4 = this->log_;
              if (pIVar4 != (ILog *)0x0) {
                local_b8 = (undefined1)rev;
                (**(code **)(*(long *)pIVar4 + 8))(pIVar4,local_b8);
                pIVar4 = this->log_;
                if (pIVar4 != (ILog *)0x0) {
                  (*(code *)**(undefined8 **)pIVar4)(pIVar4," -> CHRN Found");
                  pIVar4 = this->log_;
                  if (pIVar4 != (ILog *)0x0) {
                    (**(code **)(*(long *)pIVar4 + 8))(pIVar4,local_ac._8_8_ & 0xff);
                    pIVar4 = this->log_;
                    if (pIVar4 != (ILog *)0x0) {
                      (**(code **)(*(long *)pIVar4 + 8))(pIVar4,local_ac.h);
                      pIVar4 = this->log_;
                      if (pIVar4 != (ILog *)0x0) {
                        (**(code **)(*(long *)pIVar4 + 8))(pIVar4,local_ac.r);
                        pIVar4 = this->log_;
                        if (pIVar4 != (ILog *)0x0) {
                          (**(code **)(*(long *)pIVar4 + 8))(pIVar4,local_ac.n);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        uVar7 = GetNextByteForRev(this,side,track,uVar27 + 0x80,rev);
        uVar8 = GetNextByteForRev(this,side,track,uVar27 + 0x90,rev);
        uVar6 = local_ac._8_8_;
        if (CONCAT11(uVar7,uVar8) == local_58.computed_crc_) {
          local_ac.chrn_crc_ok = true;
LAB_00163487:
          if (this->log_ != (ILog *)0x0) {
            (**(code **)(*(long *)this->log_ + 0x20))();
          }
        }
        else {
          local_ac._8_5_ = CONCAT14(false,local_ac._8_4_);
          local_ac.status1 = SUB81(uVar6,5);
          local_ac._14_2_ = SUB82(uVar6,6);
          local_ac._8_8_ =
               CONCAT26(local_ac._14_2_,CONCAT15(local_ac.status1,local_ac._8_5_)) | 0x200000000000;
          pIVar4 = this->log_;
          if (pIVar4 != (ILog *)0x0) {
            (*(code *)**(undefined8 **)pIVar4)(pIVar4,"HEADER CRC ERROR !");
            goto LAB_00163487;
          }
        }
        uVar27 = uVar27 + 0xa0;
        pMVar22 = local_70->tracks;
        lVar20 = *(long *)((long)&pMVar22->revolution + local_80);
        lVar29 = local_88;
        if (uVar27 < *(int *)(lVar20 + 8 + local_88) - 0x38U) {
          plVar13 = (long *)(lVar20 + local_88);
          local_60 = this;
          do {
            lVar20 = *plVar13;
            iVar18 = bcmp(&DAT_001a7c70,(void *)((ulong)uVar27 + lVar20),0x38);
            if (iVar18 == 0) {
              bVar5 = true;
              lVar21 = 0;
LAB_001634f7:
              uVar23 = (uVar27 - 0x50) + (int)lVar21 * 2;
              lVar21 = lVar21 + 1;
              do {
                if ((*(char *)(lVar20 + (ulong)uVar23) != '\x01') ||
                   (*(char *)(lVar20 + (ulong)(uVar23 + 1)) != '\0')) goto LAB_0016351e;
                lVar21 = lVar21 + 1;
                uVar23 = uVar23 + 2;
              } while (lVar21 != 0x29);
              if (!bVar5) goto LAB_00163720;
              local_ac.dam_offset = uVar27;
              local_ac.dam_sync_offset = uVar27 - 0x50;
              CRC::Reset(&local_58);
              CRC::AddByteToCrc(&local_58,0xa1);
              CRC::AddByteToCrc(&local_58,0xa1);
              CRC::AddByteToCrc(&local_58,0xa1);
              uVar7 = GetNextByteForRev(this,side,track,uVar27 + 0x30,rev);
              CRC::AddByteToCrc(&local_58,uVar7);
              pIVar4 = this->log_;
              if (pIVar4 != (ILog *)0x0) {
                (*(code *)**(undefined8 **)pIVar4)(pIVar4," DATA FOUND : A1A1A1-");
                pIVar4 = this->log_;
                if (pIVar4 != (ILog *)0x0) {
                  (**(code **)(*(long *)pIVar4 + 8))(pIVar4,uVar7);
                  if (this->log_ != (ILog *)0x0) {
                    (**(code **)(*(long *)this->log_ + 0x20))();
                  }
                }
              }
              if (uVar7 == 0xf8) {
                local_ac._8_8_ = local_ac._8_8_ | 0x40000000000000;
              }
              bVar14 = local_ac.n & 7;
              uVar23 = uVar27 + 0x70;
              iVar18 = 0;
              uVar27 = uVar27 + 0x40;
              do {
                uVar9 = uVar27;
                uVar17 = (ulong)uVar23;
                uVar27 = uVar9 + 0x10;
                lVar29 = *(long *)((long)&local_70->tracks->revolution + local_80);
                uVar24 = *(uint *)(lVar29 + 8 + local_88);
                if (uVar27 < uVar24) {
                  uVar7 = GetNextByteForRev(local_60,side,track,uVar9,rev);
                  CRC::AddByteToCrc(&local_58,uVar7);
                }
                else {
                  uVar25 = 0xfffffffe;
                  b = 0;
                  uVar16 = uVar9;
                  do {
                    uVar19 = uVar16;
                    if (uVar24 <= uVar16) {
                      uVar19 = uVar16 % uVar24;
                    }
                    uVar16 = uVar16 + 2;
                    b = *(byte *)(*(long *)(lVar29 + local_88) + (long)(int)uVar19) & 1 | b * '\x02'
                    ;
                    uVar25 = uVar25 + 2;
                  } while (uVar25 < 0xe);
                  CRC::AddByteToCrc(&local_58,b);
                }
                this = local_60;
                this_00 = local_68;
                local_ac.real_size = local_ac.real_size + 1;
                iVar18 = iVar18 + 1;
                uVar23 = uVar23 + 0x10;
              } while (iVar18 != 0x80 << bVar14);
              lVar29 = *(long *)((long)&local_70->tracks->revolution + local_80);
              uVar23 = *(uint *)(lVar29 + 8 + local_88);
              if (uVar27 < uVar23 - 0x20) {
                uVar7 = GetNextByteForRev(local_60,side,track,uVar27,rev);
                uVar8 = GetNextByteForRev(this,side,track,uVar9 + 0x20,rev);
                uVar28 = CONCAT11(uVar7,uVar8);
                uVar17 = (ulong)(uVar9 + 0x30);
                this_00 = local_68;
              }
              else {
                uVar24 = 0xfffffffe;
                uVar28 = 0;
                do {
                  uVar9 = uVar24 + uVar27 + 2;
                  if (uVar23 <= uVar9) {
                    uVar9 = uVar9 % uVar23;
                  }
                  uVar28 = uVar28 * 2 |
                           *(byte *)(*(long *)(lVar29 + local_88) + (long)(int)uVar9) & 1;
                  uVar24 = uVar24 + 2;
                } while (uVar24 < 0x1e);
                pIVar4 = local_60->log_;
                if (pIVar4 != (ILog *)0x0) {
                  (*(code *)**(undefined8 **)pIVar4)(pIVar4,"Track size is too small ?!!");
                }
              }
              if (uVar28 == local_58.computed_crc_) {
                local_ac.data_crc_ok = true;
LAB_001637d6:
                if (this->log_ != (ILog *)0x0) {
                  (**(code **)(*(long *)this->log_ + 0x20))();
                }
              }
              else {
                local_ac._28_4_ = (uint)(uint3)local_ac._29_3_ << 8;
                local_ac._8_8_ = local_ac._8_8_ | 0x20200000000000;
                pIVar4 = this->log_;
                if (pIVar4 != (ILog *)0x0) {
                  (*(code *)**(undefined8 **)pIVar4)(pIVar4,"DATA CRC ERROR !");
                  goto LAB_001637d6;
                }
              }
              local_ac.index_end = (uint)uVar17;
              lVar29 = *(long *)((long)&local_70->tracks->revolution + local_80);
              iVar18 = *(int *)(lVar29 + 8 + local_88);
              uVar15 = local_ac.real_size;
              if (((local_ac.index_end < iVar18 - 0x10U) &&
                  (uVar7 = GetNextByteForRev(this,side,track,local_ac.index_end,rev),
                  uVar15 = local_ac.real_size, uVar7 != 'K')) && (uVar7 != 'N')) {
                uVar15 = local_ac.real_size + 2;
                lVar29 = *(long *)(lVar29 + local_88);
                iVar10 = bcmp(&DAT_001a7c70,(void *)(uVar17 + lVar29),0x38);
                if (iVar10 != 0) {
                  do {
                    if (iVar18 - 0x38U <= (uint)uVar17) break;
                    uVar17 = (ulong)((uint)uVar17 + 0x10);
                    uVar15 = uVar15 + 1;
                    iVar10 = bcmp(&DAT_001a7c70,(void *)(lVar29 + uVar17),0x38);
                  } while (iVar10 != 0);
                }
              }
              local_ac.real_size = uVar15;
              __position._M_current =
                   (this_00->list_sector_).
                   super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (this_00->list_sector_).
                  super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<IDisk::Sector,std::allocator<IDisk::Sector>>::
                _M_realloc_insert<IDisk::Sector_const&>
                          ((vector<IDisk::Sector,std::allocator<IDisk::Sector>> *)this_00,__position
                           ,&local_ac);
              }
              else {
                (__position._M_current)->index_end = local_ac.index_end;
                (__position._M_current)->real_size = local_ac.real_size;
                *(undefined2 *)&(__position._M_current)->field_0x12 = local_ac._18_2_;
                (__position._M_current)->dam_offset = local_ac.dam_offset;
                (__position._M_current)->dam_sync_offset = local_ac.dam_sync_offset;
                (__position._M_current)->data_crc_ok = (bool)local_ac.data_crc_ok;
                *(int3 *)&(__position._M_current)->field_0x1d = local_ac._29_3_;
                (__position._M_current)->idam_offset = local_ac.idam_offset;
                (__position._M_current)->idam_sync_offset = local_ac.idam_sync_offset;
                (__position._M_current)->c = local_ac.c;
                (__position._M_current)->h = local_ac.h;
                (__position._M_current)->r = local_ac.r;
                (__position._M_current)->n = local_ac.n;
                (__position._M_current)->chrn_crc_ok = local_ac.chrn_crc_ok;
                (__position._M_current)->status1 = local_ac.status1;
                (__position._M_current)->status2 = local_ac.status2;
                (__position._M_current)->field_0xf = local_ac._15_1_;
                ppaVar1 = &(this_00->list_sector_).
                           super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl
                           .super__Vector_impl_data._M_finish;
                *ppaVar1 = *ppaVar1 + 1;
              }
              local_78 = CONCAT62((int6)((ulong)local_78 >> 0x10),
                                  (short)local_78 + local_ac.real_size);
              uVar27 = local_ac.idam_offset + 0x41;
              pMVar22 = local_70->tracks;
              bVar5 = true;
              lVar29 = local_88;
              goto LAB_00163725;
            }
LAB_00163720:
            uVar27 = uVar27 + 1;
            bVar5 = false;
LAB_00163725:
            lVar20 = *(long *)((long)&pMVar22->revolution + local_80);
          } while ((uVar27 < *(int *)(lVar20 + 8 + lVar29) - 0x38U) &&
                  (plVar13 = (long *)(lVar20 + lVar29), !bVar5));
        }
      }
      lVar20 = *(long *)((long)&pMVar22->revolution + local_80);
      pRVar12 = (Revolution *)(lVar20 + lVar29);
    } while (uVar27 < *(int *)(lVar20 + 8 + lVar29) - 0x40U);
  }
  paVar2 = (local_68->list_sector_).
           super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar29 = (long)(local_68->list_sector_).
                 super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)paVar2;
  if (lVar29 == 0) {
    uVar27 = 0;
    uVar15 = (unsigned_short)local_78;
  }
  else {
    uVar17 = (lVar29 >> 2) * -0x71c71c71c71c71c7;
    puVar11 = &paVar2->index_end;
    uVar27 = 0;
    uVar23 = 1;
    iVar18 = 0;
    do {
      if (uVar23 != 1) {
        iVar18 = (iVar18 - uVar27) + ((anon_struct_36_14_4aa84ee9 *)(puVar11 + -8))->idam_offset +
                 -0x18;
      }
      uVar27 = *puVar11;
      uVar26 = (ulong)uVar23;
      puVar11 = puVar11 + 9;
      uVar23 = uVar23 + 1;
    } while (uVar26 <= uVar17 && uVar17 - uVar26 != 0);
    iVar10 = iVar18 + 0xf;
    if (-1 < iVar18) {
      iVar10 = iVar18;
    }
    local_68->gap3_size_ = (int)((ulong)(long)(iVar10 >> 4) / uVar17);
    uVar27 = (uint)local_78 + 0x100;
    if ((char)local_78 == '\0') {
      uVar27 = (uint)local_78;
    }
    uVar15 = (unsigned_short)uVar27;
    uVar27 = uVar27 & 0xffff;
  }
  local_68->full_size_ = uVar27;
  CRC::~CRC(&local_58);
  return uVar15;
LAB_0016351e:
  bVar5 = false;
  if (lVar21 == 0x28) goto LAB_00163720;
  goto LAB_001634f7;
}

Assistant:

unsigned short IDisk::GetTrackInfoForRev(int side, int track, Track* track_buffer, int rev)
{
   unsigned short size;
   CRC crc_local;
   // Compute size of track :
   // Header
   size = 256;

   unsigned int index = 0;
   // States :
   // 0 - waiting for next sector id
   // 1 - waiting for next sector data
   // 2 - waiting for end of datas

   // A1 = 4489, FE =
   const char pattern_fe[] = {
      0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0, 1,
      0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1, 0, 0
   };
   const char pattern_f[] = {
      0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0, 1,
      0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1
   };

   while (index < side_[side].tracks[track].revolution[rev].size - (int)sizeof(pattern_fe))
   {
      // Test the pervious 8 bytes (should be '00')
      bool sync_ok = (index > 8 * 16);

      if (sync_ok)
      {
         sync_ok = (memcmp(pattern_fe, &side_[side].tracks[track].revolution[rev].bitfield[index],
                           sizeof(pattern_fe)) == 0);
         if (sync_ok)
         {
            for (int i = 0; i < SYNC_BIT_NUMBER && sync_ok; i++)
            {
               if (side_[side].tracks[track].revolution[rev].bitfield[index - SYNC_BIT_NUMBER * 2 + i * 2] != 1
                  || side_[side].tracks[track].revolution[rev].bitfield[index - SYNC_BIT_NUMBER * 2 + i * 2 + 1] != 0)
               {
                  sync_ok = false;
               }
            }
         }
      }
      if (sync_ok)
      {
         // Found ! New sector
         crc_local.Reset();
         crc_local.AddByteToCrc(0xA1);
         crc_local.AddByteToCrc(0xA1);
         crc_local.AddByteToCrc(0xA1);
         crc_local.AddByteToCrc(0xFE);

         Sector sector;
         memset(&sector, 0, sizeof(sector));
         // Keep the offset position !
         sector.idam_offset = index;
         sector.idam_sync_offset = index - SYNC_BIT_NUMBER * 2;

         // Adding CHRN to the next sector
         index += sizeof(pattern_fe);

         sector.c = GetNextByteForRev(side, track, index, rev);
         crc_local.AddByteToCrc(sector.c);
         index += 16;
         sector.h = GetNextByteForRev(side, track, index, rev);
         crc_local.AddByteToCrc(sector.h);
         index += 16;
         sector.r = GetNextByteForRev(side, track, index, rev);
         crc_local.AddByteToCrc(sector.r);
         index += 16;
         sector.n = GetNextByteForRev(side, track, index, rev);
         crc_local.AddByteToCrc(sector.n);
         index += 16;

         LOG("Track : ");
         LOGB(track);
         LOG(" - REV :");
         LOGB(rev);
         LOG(" -> CHRN Found");
         LOGB(sector.c);
         LOGB(sector.h);
         LOGB(sector.r);
         LOGB(sector.n);

         // Do we have CRC error ?
         unsigned short crc = GetNextByteForRev(side, track, index, rev);
         crc <<= 8;
         index += 16;
         crc |= GetNextByteForRev(side, track, index, rev);
         index += 16;

         // Set status 1
         if (crc != crc_local.GetCRC())
         {
            sector.chrn_crc_ok = false;
            sector.status1 |= 0x20;
            LOG("HEADER CRC ERROR !");
         }
         else
         {
            sector.chrn_crc_ok = true;
         }
         LOGEOL
         // Now, waiting for A1A1A1F8/B
         bool data_found = false;
         while ((index < side_[side].tracks[track].revolution[rev].size - (int)sizeof(pattern_f)) && (!data_found))
         {
            bool data_ok = (memcmp(pattern_fe, &side_[side].tracks[track].revolution[rev].bitfield[index],
                                   sizeof(pattern_f)) == 0);

            if (data_ok)
            {
               for (int i = 0; i < SYNC_BIT_NUMBER && sync_ok; i++)
               {
                  if (side_[side].tracks[track].revolution[rev].bitfield[index - SYNC_BIT_NUMBER * 2 + i * 2] != 1
                     || side_[side].tracks[track].revolution[rev].bitfield[index - SYNC_BIT_NUMBER * 2 + i * 2 + 1] != 0
                  )
                  {
                     data_ok = false;
                  }
               }
            }

            if (data_ok)
            {
               data_found = true;
               // Keep the offset position
               sector.dam_offset = index;
               sector.dam_sync_offset = index - SYNC_BIT_NUMBER * 2;

               // Yeah
               index += sizeof(pattern_f) - 8;

               // Set the Status according to the F8/FB
               crc_local.Reset();
               crc_local.AddByteToCrc(0xA1);
               crc_local.AddByteToCrc(0xA1);
               crc_local.AddByteToCrc(0xA1);
               unsigned char byte = GetNextByteForRev(side, track, index, rev);
               crc_local.AddByteToCrc(byte);
               LOG(" DATA FOUND : A1A1A1-");
               LOGB(byte);
               LOGEOL

               index += 16;

               if (byte == 0xF8) // Erased
               {
                  sector.status2 |= 0x40;
               }

               // Now, gather datas...
               int sizeMaxSector = (sector.n & 0x7);
               for (int data_count = 0; data_count < (0x80 << sizeMaxSector); data_count++)
               {
                  if (index + 16 < side_[side].tracks[track].revolution[rev].size)
                  {
                     byte = GetNextByteForRev(side, track, index, rev);
                     crc_local.AddByteToCrc(byte);
                     sector.real_size++;
                     index += 16;
                  }
                  else
                  {
                     // Go through the index hole
                     unsigned char return_value = 0;

                     for (int i = 0; i < 16; i += 2)
                     {
                        int readoffset;
                        return_value <<= 1;
                        if (index >= side_[side].tracks[track].revolution[rev].size)
                        {
                           readoffset = index % side_[side].tracks[track].revolution[rev].size;
                        }
                        else
                        {
                           readoffset = index;
                        }
                        unsigned char b = side_[side].tracks[track].revolution[rev].bitfield[readoffset];
                        index += 2;
                        return_value |= b & 0x1;
                     }
                     crc_local.AddByteToCrc(return_value);
                     sector.real_size++;
                     //index = readoffset;
                  }
               }
               if (index < side_[side].tracks[track].revolution[rev].size - 32)
               {
                  // CRC Check
                  crc = GetNextByteForRev(side, track, index, rev);
                  crc <<= 8;
                  index += 16;
                  crc |= GetNextByteForRev(side, track, index, rev);
                  index += 16;
               }
               else
               {
                  crc = 0;

                  for (int i = 0; i < 32; i += 2)
                  {
                     int readoffset;
                     crc <<= 1;
                     if (index >= side_[side].tracks[track].revolution[rev].size)
                     {
                        readoffset = index % side_[side].tracks[track].revolution[rev].size;
                     }
                     else
                     {
                        readoffset = index;
                     }
                     unsigned char b = side_[side].tracks[track].revolution[rev].bitfield[readoffset];
                     index += 2;
                     crc |= b & 0x1;
                  }

                  //
                  LOG("Track size is too small ?!!");
               }
               // Set status 1
               if (crc != crc_local.GetCRC())
               {
                  sector.data_crc_ok = false;
                  sector.status1 |= 0x20;
                  sector.status2 |= 0x20;
                  LOG("DATA CRC ERROR !");
               }
               else
               {
                  sector.data_crc_ok = true;
               }
               LOGEOL
               // Keep this to compute GAP3 size
               sector.index_end = index;

               if (index < side_[side].tracks[track].revolution[rev].size - 16)
               {
                  // End of sector. Look at the GAP until Sync is found - Only get it if different from 0x4E
                  byte = GetNextByteForRev(side, track, index, rev);
                  if (byte != 0x4E && byte != 0x4B)
                  {
                     sector.real_size += 2; // Add CRC + first gap

                     while ((memcmp(pattern_fe, &side_[side].tracks[track].revolution[rev].bitfield[index],
                                    sizeof(pattern_f)) != 0)
                        && (index < side_[side].tracks[track].revolution[rev].size - (int)sizeof(pattern_f)))
                     {
                        index += 16;
                        ++sector.real_size;
                        /*byte = GetNextByteForRev (side, track, index );
                        index += 16;*/
                     }
                  }
               }

               // NOTE : It can be a bit misalign, so sync bytes are watched on a bit basis
               // TODO

               track_buffer->list_sector_.push_back(sector);

               size += sector.real_size;

               // Adaptation: rewind to sector.DAMOffset to avoid forgetting interlaced sectors
               //index = sector.DAMOffset + 64 + 1;
               index = sector.idam_offset + 64 + 1;
            }
            else
            {
               ++index;
            }
         }

         // Next sector
      }
      else
      {
         ++index;
      }
   }

   // Avegare GAP3 size :
   int gap_3_total = 0;
   int offset_end = 0;
   if (track_buffer->list_sector_.size() > 0)
   {
      for (unsigned int i = 0; i < track_buffer->list_sector_.size(); i++)
      {
         if (i > 0)
         {
            gap_3_total += track_buffer->list_sector_[i].idam_offset - 24 - offset_end;
         }
         offset_end = track_buffer->list_sector_[i].index_end;
      }
      //gap_3_total += side_[side].Tracks[track].Revolution[0].Size - offset_end;

      track_buffer->gap3_size_ = gap_3_total / 16 / track_buffer->list_sector_.size();

      if ((size & 0xFFFFFF00) < size)
      {
         size += 0x100;
      }
      track_buffer->full_size_ = size;
   }
   else
   {
      track_buffer->full_size_ = 0;
   }


   // TODO : Compute real size of track
   return size;
}